

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
* toml::detail::parse_local_date_only<toml::type_config>
            (result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
             *__return_storage_ptr__,location *loc,context<toml::type_config> *ctx)

{
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pvVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  uint uVar4;
  size_type v;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  uint *puVar6;
  value_type *pvVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  int iVar9;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  uint uVar12;
  int iVar13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  source_location src;
  result<int,_toml::detail::none_t> day_r;
  result<int,_toml::detail::none_t> month_r;
  result<int,_toml::detail::none_t> year_r;
  string str;
  region reg;
  location first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  undefined1 local_7c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7a8;
  undefined8 local_798;
  _Alloc_hider _Stack_790;
  _Alloc_hider local_788;
  undefined1 auStack_780 [24];
  pointer local_768;
  pointer pbStack_760;
  pointer local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  undefined1 local_728 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_718;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_708;
  _Alloc_hider local_6f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6e0 [2];
  result<int,_toml::detail::none_t> local_6c0;
  result<int,_toml::detail::none_t> local_6b8;
  result<int,_toml::detail::none_t> local_6b0;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  region local_548;
  location local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_498;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_490;
  undefined4 local_488;
  undefined4 uStack_484;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  undefined4 local_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 local_468;
  undefined4 uStack_464;
  undefined4 uStack_460;
  undefined4 uStack_45c;
  _Alloc_hider local_458;
  size_t local_450;
  char local_448 [16];
  pointer local_438;
  pointer pbStack_430;
  pointer local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_418;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_410;
  undefined4 local_408;
  undefined4 uStack_404;
  undefined4 uStack_400;
  undefined4 uStack_3fc;
  undefined4 local_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 local_3e8;
  undefined4 uStack_3e4;
  undefined4 uStack_3e0;
  undefined4 uStack_3dc;
  _Alloc_hider local_3d8;
  size_t local_3d0;
  char local_3c8 [16];
  pointer local_3b8;
  pointer pbStack_3b0;
  pointer local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_398;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_390;
  undefined4 local_388;
  undefined4 uStack_384;
  undefined4 uStack_380;
  undefined4 uStack_37c;
  undefined4 local_378;
  undefined4 uStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 local_368;
  undefined4 uStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  _Alloc_hider local_358;
  size_t local_350;
  char local_348 [16];
  pointer local_338;
  pointer pbStack_330;
  pointer local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_318;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_310;
  undefined4 local_308;
  undefined4 uStack_304;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  undefined4 local_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined4 local_2e8;
  undefined4 uStack_2e4;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  _Alloc_hider local_2d8;
  size_t local_2d0;
  char local_2c8 [16];
  pointer local_2b8;
  pointer pbStack_2b0;
  pointer local_2a8;
  location local_2a0;
  success<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>_>
  local_258;
  failure<toml::error_info> local_1e8;
  failure<toml::error_info> local_190;
  failure<toml::error_info> local_138;
  failure<toml::error_info> local_e0;
  failure<toml::error_info> local_88;
  
  location::location(&local_4e0,loc);
  syntax::local_date((sequence *)local_7c8,&ctx->toml_spec_);
  sequence::scan(&local_548,(sequence *)local_7c8,loc);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          (local_7c8 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548.source_.
         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_568,
               "toml::parse_local_date: invalid date: date must be like: 1234-05-06, yyyy-mm-dd.",""
              );
    syntax::local_date((sequence *)local_728,&ctx->toml_spec_);
    location::location(&local_2a0,loc);
    local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"");
    make_syntax_error<toml::detail::sequence>
              ((error_info *)local_7c8,&local_568,(sequence *)local_728,&local_2a0,&local_588);
    err<toml::error_info>(&local_88,(error_info *)local_7c8);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_88);
    failure<toml::error_info>::~failure(&local_88);
    if (_Stack_790._M_p != auStack_780) {
      operator_delete(_Stack_790._M_p,auStack_780._0_8_ + 1);
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_7a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c8._0_8_ != &local_7b8) {
      operator_delete((void *)local_7c8._0_8_,local_7b8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_dataplus._M_p != &local_588.field_2) {
      operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
    }
    location::~location(&local_2a0);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )(local_728 + 8));
    local_6a8._M_dataplus._M_p = local_568._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_568._M_dataplus._M_p == &local_568.field_2) goto LAB_003d94c4;
  }
  else {
    make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (&local_6a8,
               (detail *)
               (local_548.first_ +
               *(size_type *)
                local_548.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr),
               (uchar *)(*(size_type *)
                          local_548.source_.
                          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + local_548.last_),in_RCX);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6a8,0,4);
    from_string<int>((detail *)&local_6b0,(string *)local_7c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c8._0_8_ != &local_7b8) {
      operator_delete((void *)local_7c8._0_8_,local_7b8._M_allocated_capacity + 1);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6a8,5,2);
    from_string<int>((detail *)&local_6b8,(string *)local_7c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c8._0_8_ != &local_7b8) {
      operator_delete((void *)local_7c8._0_8_,local_7b8._M_allocated_capacity + 1);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6a8,8,2);
    from_string<int>((detail *)&local_6c0,(string *)local_7c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c8._0_8_ != &local_7b8) {
      operator_delete((void *)local_7c8._0_8_,local_7b8._M_allocated_capacity + 1);
    }
    if (local_6b0.is_ok_ == false) {
      region::region((region *)local_728,&local_4e0);
      source_location::source_location((source_location *)local_7c8,(region *)local_728);
      region::~region((region *)local_728);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_748,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6a8,0,4
                );
      pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::replace(&local_748,0,0,"toml::parse_local_date: failed to read year `",0x2d);
      local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if (paVar11 == paVar10) {
        local_7e8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_7e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_7e8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_7e8._M_dataplus._M_p = (pointer)paVar11;
      }
      local_7e8._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::append(&local_7e8,"`");
      local_648._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar11 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_648._M_dataplus._M_p == paVar11) {
        local_648.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_648.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
      }
      else {
        local_648.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_648._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      local_2d8._M_p = local_2c8;
      local_2e8 = (undefined4)local_798;
      uStack_2e4 = local_798._4_4_;
      uStack_2e0 = _Stack_790._M_p._0_4_;
      uStack_2dc = _Stack_790._M_p._4_4_;
      local_2f8 = local_7a8._M_allocated_capacity._0_4_;
      uStack_2f4 = local_7a8._M_allocated_capacity._4_4_;
      uStack_2f0 = local_7a8._8_4_;
      uStack_2ec = local_7a8._12_4_;
      local_308 = local_7b8._M_allocated_capacity._0_4_;
      uStack_304 = local_7b8._M_allocated_capacity._4_4_;
      uStack_300 = local_7b8._8_4_;
      uStack_2fc = local_7b8._12_4_;
      local_318 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_7c8._0_8_;
      p_Stack_310 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_7c8._8_8_;
      if (local_788._M_p == auStack_780 + 8) {
        local_2c8[8] = auStack_780[0x10];
        local_2c8[9] = auStack_780[0x11];
        local_2c8[10] = auStack_780[0x12];
        local_2c8[0xb] = auStack_780[0x13];
        local_2c8[0xc] = auStack_780[0x14];
        local_2c8[0xd] = auStack_780[0x15];
        local_2c8[0xe] = auStack_780[0x16];
        local_2c8[0xf] = auStack_780[0x17];
      }
      else {
        local_2d8._M_p = local_788._M_p;
      }
      local_2d0 = auStack_780._0_8_;
      auStack_780._0_8_ = 0;
      auStack_780._8_8_ = auStack_780._8_8_ & 0xffffffffffffff00;
      local_2b8 = local_768;
      pbStack_2b0 = pbStack_760;
      local_2a8 = local_758;
      local_768 = (pointer)0x0;
      pbStack_760 = (pointer)0x0;
      local_758 = (pointer)0x0;
      local_788._M_p = auStack_780 + 8;
      local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"here","");
      make_error_info<>((error_info *)local_728,&local_648,(source_location *)&local_318,&local_5a8)
      ;
      err<toml::error_info>(&local_e0,(error_info *)local_728);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_e0);
      failure<toml::error_info>::~failure(&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f0._M_p != local_6e0) {
        operator_delete(local_6f0._M_p,local_6e0[0]._M_allocated_capacity + 1);
      }
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_708);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_728._0_8_ != &local_718) {
        operator_delete((void *)local_728._0_8_,(ulong)(local_718._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
        operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
      }
      source_location::~source_location((source_location *)&local_318);
      uVar14 = local_648.field_2._M_allocated_capacity;
      _Var15._M_p = local_648._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_648._M_dataplus._M_p != &local_648.field_2) {
LAB_003d945a:
        operator_delete(_Var15._M_p,uVar14 + 1);
      }
LAB_003d9462:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
        operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_748._M_dataplus._M_p != &local_748.field_2) {
LAB_003d9491:
        operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
      }
LAB_003d9499:
      source_location::~source_location((source_location *)local_7c8);
    }
    else {
      if (local_6b8.is_ok_ == false) {
        region::region((region *)local_728,&local_4e0);
        source_location::source_location((source_location *)local_7c8,(region *)local_728);
        region::~region((region *)local_728);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_748,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6a8,5
                   ,2);
        pbVar8 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                           (&local_748,0,0,"toml::parse_local_date: failed to read month `",0x2e);
        local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pbVar8->_M_dataplus)._M_p;
        paVar10 = &pbVar8->field_2;
        if (paVar11 == paVar10) {
          local_7e8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_7e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        }
        else {
          local_7e8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_7e8._M_dataplus._M_p = (pointer)paVar11;
        }
        local_7e8._M_string_length = pbVar8->_M_string_length;
        (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
        pbVar8->_M_string_length = 0;
        (pbVar8->field_2)._M_local_buf[0] = '\0';
        pbVar8 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                           (&local_7e8,"`");
        local_668._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
        paVar11 = &pbVar8->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_668._M_dataplus._M_p == paVar11) {
          local_668.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_668.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
          local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
        }
        else {
          local_668.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        }
        local_668._M_string_length = pbVar8->_M_string_length;
        (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
        pbVar8->_M_string_length = 0;
        (pbVar8->field_2)._M_local_buf[0] = '\0';
        local_358._M_p = local_348;
        local_368 = (undefined4)local_798;
        uStack_364 = local_798._4_4_;
        uStack_360 = _Stack_790._M_p._0_4_;
        uStack_35c = _Stack_790._M_p._4_4_;
        local_378 = local_7a8._M_allocated_capacity._0_4_;
        uStack_374 = local_7a8._M_allocated_capacity._4_4_;
        uStack_370 = local_7a8._8_4_;
        uStack_36c = local_7a8._12_4_;
        local_388 = local_7b8._M_allocated_capacity._0_4_;
        uStack_384 = local_7b8._M_allocated_capacity._4_4_;
        uStack_380 = local_7b8._8_4_;
        uStack_37c = local_7b8._12_4_;
        local_398 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_7c8._0_8_;
        p_Stack_390 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_7c8._8_8_;
        if (local_788._M_p == auStack_780 + 8) {
          local_348[8] = auStack_780[0x10];
          local_348[9] = auStack_780[0x11];
          local_348[10] = auStack_780[0x12];
          local_348[0xb] = auStack_780[0x13];
          local_348[0xc] = auStack_780[0x14];
          local_348[0xd] = auStack_780[0x15];
          local_348[0xe] = auStack_780[0x16];
          local_348[0xf] = auStack_780[0x17];
        }
        else {
          local_358._M_p = local_788._M_p;
        }
        local_350 = auStack_780._0_8_;
        auStack_780._0_8_ = 0;
        auStack_780._8_8_ = auStack_780._8_8_ & 0xffffffffffffff00;
        local_338 = local_768;
        pbStack_330 = pbStack_760;
        local_328 = local_758;
        local_768 = (pointer)0x0;
        pbStack_760 = (pointer)0x0;
        local_758 = (pointer)0x0;
        local_788._M_p = auStack_780 + 8;
        local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"here","");
        make_error_info<>((error_info *)local_728,&local_668,(source_location *)&local_398,
                          &local_5c8);
        err<toml::error_info>(&local_138,(error_info *)local_728);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_138)
        ;
        failure<toml::error_info>::~failure(&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f0._M_p != local_6e0) {
          operator_delete(local_6f0._M_p,local_6e0[0]._M_allocated_capacity + 1);
        }
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_708);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_728._0_8_ != &local_718) {
          operator_delete((void *)local_728._0_8_,(ulong)(local_718._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
          operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
        }
        source_location::~source_location((source_location *)&local_398);
        uVar14 = local_668.field_2._M_allocated_capacity;
        _Var15._M_p = local_668._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_668._M_dataplus._M_p != &local_668.field_2) goto LAB_003d945a;
        goto LAB_003d9462;
      }
      if (local_6c0.is_ok_ == false) {
        region::region((region *)local_728,&local_4e0);
        source_location::source_location((source_location *)local_7c8,(region *)local_728);
        region::~region((region *)local_728);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_748,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6a8,8
                   ,2);
        pbVar8 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                           (&local_748,0,0,"toml::parse_local_date: failed to read day `",0x2c);
        local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pbVar8->_M_dataplus)._M_p;
        paVar10 = &pbVar8->field_2;
        if (paVar11 == paVar10) {
          local_7e8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_7e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        }
        else {
          local_7e8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_7e8._M_dataplus._M_p = (pointer)paVar11;
        }
        local_7e8._M_string_length = pbVar8->_M_string_length;
        (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
        pbVar8->_M_string_length = 0;
        (pbVar8->field_2)._M_local_buf[0] = '\0';
        pbVar8 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                           (&local_7e8,"`");
        local_688._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
        paVar11 = &pbVar8->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_688._M_dataplus._M_p == paVar11) {
          local_688.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_688.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
          local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
        }
        else {
          local_688.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        }
        local_688._M_string_length = pbVar8->_M_string_length;
        (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
        pbVar8->_M_string_length = 0;
        (pbVar8->field_2)._M_local_buf[0] = '\0';
        local_3d8._M_p = local_3c8;
        local_3e8 = (undefined4)local_798;
        uStack_3e4 = local_798._4_4_;
        uStack_3e0 = _Stack_790._M_p._0_4_;
        uStack_3dc = _Stack_790._M_p._4_4_;
        local_3f8 = local_7a8._M_allocated_capacity._0_4_;
        uStack_3f4 = local_7a8._M_allocated_capacity._4_4_;
        uStack_3f0 = local_7a8._8_4_;
        uStack_3ec = local_7a8._12_4_;
        local_408 = local_7b8._M_allocated_capacity._0_4_;
        uStack_404 = local_7b8._M_allocated_capacity._4_4_;
        uStack_400 = local_7b8._8_4_;
        uStack_3fc = local_7b8._12_4_;
        local_418 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_7c8._0_8_;
        p_Stack_410 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_7c8._8_8_;
        if (local_788._M_p == auStack_780 + 8) {
          local_3c8[8] = auStack_780[0x10];
          local_3c8[9] = auStack_780[0x11];
          local_3c8[10] = auStack_780[0x12];
          local_3c8[0xb] = auStack_780[0x13];
          local_3c8[0xc] = auStack_780[0x14];
          local_3c8[0xd] = auStack_780[0x15];
          local_3c8[0xe] = auStack_780[0x16];
          local_3c8[0xf] = auStack_780[0x17];
        }
        else {
          local_3d8._M_p = local_788._M_p;
        }
        local_3d0 = auStack_780._0_8_;
        auStack_780._0_8_ = 0;
        auStack_780._8_8_ = auStack_780._8_8_ & 0xffffffffffffff00;
        local_3b8 = local_768;
        pbStack_3b0 = pbStack_760;
        local_3a8 = local_758;
        local_768 = (pointer)0x0;
        pbStack_760 = (pointer)0x0;
        local_758 = (pointer)0x0;
        local_788._M_p = auStack_780 + 8;
        local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"here","");
        make_error_info<>((error_info *)local_728,&local_688,(source_location *)&local_418,
                          &local_5e8);
        err<toml::error_info>(&local_190,(error_info *)local_728);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_190)
        ;
        failure<toml::error_info>::~failure(&local_190);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f0._M_p != local_6e0) {
          operator_delete(local_6f0._M_p,local_6e0[0]._M_allocated_capacity + 1);
        }
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_708);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_728._0_8_ != &local_718) {
          operator_delete((void *)local_728._0_8_,(ulong)(local_718._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
          operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
        }
        source_location::~source_location((source_location *)&local_418);
        uVar14 = local_688.field_2._M_allocated_capacity;
        _Var15._M_p = local_688._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_688._M_dataplus._M_p != &local_688.field_2) goto LAB_003d945a;
        goto LAB_003d9462;
      }
      puVar6 = (uint *)result<int,_toml::detail::none_t>::unwrap
                                 (&local_6b0,(source_location)0x56a158);
      uVar3 = *puVar6;
      puVar6 = (uint *)result<int,_toml::detail::none_t>::unwrap
                                 (&local_6b8,(source_location)0x56a170);
      uVar4 = *puVar6;
      pvVar7 = result<int,_toml::detail::none_t>::unwrap(&local_6c0,(source_location)0x56a188);
      v = local_548.source_name_._M_string_length;
      iVar9 = 0x1c;
      if ((uVar3 & 3) == 0) {
        uVar12 = uVar3 * -0x3d70a3d7 + 0x51eb850;
        iVar9 = 0x1d;
        if ((uVar12 >> 2 | uVar3 * 0x40000000) < 0x28f5c29) {
          iVar9 = ((uVar12 >> 4 | uVar3 * -0x70000000) < 0xa3d70b) + 0x1c;
        }
      }
      if ((0xb < uVar4) ||
         ((iVar13 = 0x1e, (0xa50U >> (uVar4 & 0x1f) & 1) == 0 && (iVar13 = iVar9, uVar4 != 2)))) {
        iVar13 = 0x1f;
      }
      if (((uVar4 - 0xd < 0xfffffff4) || (iVar9 = *pvVar7, iVar9 < 1)) || (iVar13 < iVar9)) {
        region::region((region *)local_728,&local_4e0);
        source_location::source_location((source_location *)local_7c8,(region *)local_728);
        region::~region((region *)local_728);
        local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_608,"toml::parse_local_date: invalid date.","");
        local_458._M_p = local_448;
        local_468 = (undefined4)local_798;
        uStack_464 = local_798._4_4_;
        uStack_460 = _Stack_790._M_p._0_4_;
        uStack_45c = _Stack_790._M_p._4_4_;
        local_478 = local_7a8._M_allocated_capacity._0_4_;
        uStack_474 = local_7a8._M_allocated_capacity._4_4_;
        uStack_470 = local_7a8._8_4_;
        uStack_46c = local_7a8._12_4_;
        local_488 = local_7b8._M_allocated_capacity._0_4_;
        uStack_484 = local_7b8._M_allocated_capacity._4_4_;
        uStack_480 = local_7b8._8_4_;
        uStack_47c = local_7b8._12_4_;
        local_498 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_7c8._0_8_;
        p_Stack_490 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_7c8._8_8_;
        if (local_788._M_p == auStack_780 + 8) {
          local_448[8] = auStack_780[0x10];
          local_448[9] = auStack_780[0x11];
          local_448[10] = auStack_780[0x12];
          local_448[0xb] = auStack_780[0x13];
          local_448[0xc] = auStack_780[0x14];
          local_448[0xd] = auStack_780[0x15];
          local_448[0xe] = auStack_780[0x16];
          local_448[0xf] = auStack_780[0x17];
        }
        else {
          local_458._M_p = local_788._M_p;
        }
        local_450 = auStack_780._0_8_;
        auStack_780._0_8_ = 0;
        auStack_780._8_8_ = auStack_780._8_8_ & 0xffffffffffffff00;
        local_438 = local_768;
        pbStack_430 = pbStack_760;
        local_428 = local_758;
        local_768 = (pointer)0x0;
        pbStack_760 = (pointer)0x0;
        local_758 = (pointer)0x0;
        local_788._M_p = auStack_780 + 8;
        local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_628,
                   "month must be 01-12, day must be any of 01-28,29,30,31 depending on the month/year."
                   ,"");
        make_error_info<>((error_info *)local_728,&local_608,(source_location *)&local_498,
                          &local_628);
        err<toml::error_info>(&local_1e8,(error_info *)local_728);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_1e8)
        ;
        failure<toml::error_info>::~failure(&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f0._M_p != local_6e0) {
          operator_delete(local_6f0._M_p,local_6e0[0]._M_allocated_capacity + 1);
        }
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_708);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_728._0_8_ != &local_718) {
          operator_delete((void *)local_728._0_8_,(ulong)(local_718._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_628._M_dataplus._M_p != &local_628.field_2) {
          operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
        }
        source_location::~source_location((source_location *)&local_498);
        local_748.field_2._M_allocated_capacity = local_608.field_2._M_allocated_capacity;
        local_748._M_dataplus._M_p = local_608._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_608._M_dataplus._M_p != &local_608.field_2) goto LAB_003d9491;
        goto LAB_003d9499;
      }
      paVar2 = &local_548.source_name_.field_2;
      local_7b8._M_allocated_capacity = (size_type)&local_7a8;
      local_7c8._0_8_ =
           local_548.source_.
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_7c8._8_8_ =
           local_548.source_.
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      local_548.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_548.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548.source_name_._M_dataplus._M_p == paVar2) {
        local_7a8._8_8_ = local_548.source_name_.field_2._8_8_;
      }
      else {
        local_7b8._M_allocated_capacity = (size_type)local_548.source_name_._M_dataplus._M_p;
      }
      local_7b8._8_8_ = local_548.source_name_._M_string_length;
      local_548.source_name_._M_string_length = 0;
      local_548.source_name_.field_2._M_local_buf[0] = '\0';
      local_798 = (pointer)local_548.length_;
      _Stack_790._M_p = (pointer)local_548.first_;
      local_788._M_p = (pointer)local_548.first_line_;
      auStack_780._0_8_ = local_548.first_column_;
      auStack_780._8_8_ = local_548.last_;
      auStack_780._16_8_ = local_548.last_line_;
      local_768 = (pointer)local_548.last_column_;
      pbStack_760 = (pointer)CONCAT44(pbStack_760._4_4_,
                                      uVar3 & 0xffff |
                                      uVar4 * 0x10000 + 0xff0000 & 0xff0000 | iVar9 << 0x18);
      local_548.source_name_._M_dataplus._M_p = (pointer)paVar2;
      ok<std::tuple<toml::local_date,toml::local_date_format_info,toml::detail::region>>
                (&local_258,(toml *)local_7c8,
                 (tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region> *)v);
      _Var5._M_pi = local_258.value.
                    super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                    .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
                    super__Tuple_impl<2UL,_toml::detail::region>.
                    super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_.
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      __return_storage_ptr__->is_ok_ = true;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      ((long)&(__return_storage_ptr__->field_1).succ_.value.
              super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
              .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
              super__Tuple_impl<2UL,_toml::detail::region>.
              super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 8))->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_258.value.
      super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>.
      super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
      super__Tuple_impl<2UL,_toml::detail::region>.
      super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(element_type **)
       &(__return_storage_ptr__->field_1).succ_.value.
        super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
        .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
        super__Tuple_impl<2UL,_toml::detail::region>.
        super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_ =
           local_258.value.
           super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
           .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
           super__Tuple_impl<2UL,_toml::detail::region>.
           super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_.
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      ((long)&(__return_storage_ptr__->field_1).succ_.value.
              super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
              .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
              super__Tuple_impl<2UL,_toml::detail::region>.
              super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 8))->_M_pi =
           _Var5._M_pi;
      local_258.value.
      super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>.
      super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
      super__Tuple_impl<2UL,_toml::detail::region>.
      super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      pvVar1 = &(__return_storage_ptr__->field_1).fail_.value.locations_;
      (((string *)
       ((long)&(__return_storage_ptr__->field_1).succ_.value.
               super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x10))->_M_dataplus
      )._M_p = (pointer)pvVar1;
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)&local_258.value.
                          super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                          .
                          super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>
                          .super__Tuple_impl<2UL,_toml::detail::region>.
                          super__Head_base<2UL,_toml::detail::region,_false> + 0x20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258.value.
             super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
             .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
             super__Tuple_impl<2UL,_toml::detail::region>.
             super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.
             _M_dataplus._M_p == paVar2) {
        (pvVar1->
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_258.value.
                               super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                               .
                               super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>
                               .super__Tuple_impl<2UL,_toml::detail::region>.
                               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.
                               source_name_.field_2._M_allocated_capacity._1_7_,
                               local_258.value.
                               super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                               .
                               super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>
                               .super__Tuple_impl<2UL,_toml::detail::region>.
                               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.
                               source_name_.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->field_1).succ_.value.
                 super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                 .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x28) =
             local_258.value.
             super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
             .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
             super__Tuple_impl<2UL,_toml::detail::region>.
             super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.field_2.
             _8_8_;
      }
      else {
        (((string *)
         ((long)&(__return_storage_ptr__->field_1).succ_.value.
                 super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                 .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
                 super__Tuple_impl<2UL,_toml::detail::region>.
                 super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x10))->
        _M_dataplus)._M_p =
             local_258.value.
             super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
             .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
             super__Tuple_impl<2UL,_toml::detail::region>.
             super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.
             _M_dataplus._M_p;
        (__return_storage_ptr__->field_1).fail_.value.locations_.
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_258.value.
                               super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                               .
                               super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>
                               .super__Tuple_impl<2UL,_toml::detail::region>.
                               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.
                               source_name_.field_2._M_allocated_capacity._1_7_,
                               local_258.value.
                               super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                               .
                               super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>
                               .super__Tuple_impl<2UL,_toml::detail::region>.
                               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.
                               source_name_.field_2._M_local_buf[0]);
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->field_1).succ_.value.
               super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x18) =
           local_258.value.
           super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
           .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
           super__Tuple_impl<2UL,_toml::detail::region>.
           super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.
           _M_string_length;
      local_258.value.
      super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>.
      super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
      super__Tuple_impl<2UL,_toml::detail::region>.
      super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_._M_string_length
           = 0;
      local_258.value.
      super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>.
      super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
      super__Tuple_impl<2UL,_toml::detail::region>.
      super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_.field_2.
      _M_local_buf[0] = '\0';
      *(size_t *)
       ((long)&(__return_storage_ptr__->field_1).succ_.value.
               super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x60) =
           local_258.value.
           super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
           .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
           super__Tuple_impl<2UL,_toml::detail::region>.
           super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.last_column_;
      *(size_t *)
       ((long)&(__return_storage_ptr__->field_1).succ_.value.
               super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x50) =
           local_258.value.
           super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
           .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
           super__Tuple_impl<2UL,_toml::detail::region>.
           super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.last_;
      *(size_t *)
       ((long)&(__return_storage_ptr__->field_1).succ_.value.
               super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x58) =
           local_258.value.
           super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
           .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
           super__Tuple_impl<2UL,_toml::detail::region>.
           super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.last_line_;
      *(size_t *)
       ((long)&(__return_storage_ptr__->field_1).succ_.value.
               super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x40) =
           local_258.value.
           super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
           .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
           super__Tuple_impl<2UL,_toml::detail::region>.
           super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.first_line_;
      *(size_t *)
       ((long)&(__return_storage_ptr__->field_1).succ_.value.
               super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x48) =
           local_258.value.
           super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
           .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
           super__Tuple_impl<2UL,_toml::detail::region>.
           super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.first_column_;
      *(size_t *)
       ((long)&(__return_storage_ptr__->field_1).succ_.value.
               super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x30) =
           local_258.value.
           super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
           .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
           super__Tuple_impl<2UL,_toml::detail::region>.
           super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.length_;
      *(size_t *)
       ((long)&(__return_storage_ptr__->field_1).succ_.value.
               super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
               .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
               super__Tuple_impl<2UL,_toml::detail::region>.
               super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl + 0x38) =
           local_258.value.
           super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
           .super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
           super__Tuple_impl<2UL,_toml::detail::region>.
           super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.first_;
      *(local_date *)((long)&__return_storage_ptr__->field_1 + 0x68) =
           local_258.value.
           super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
           .super__Head_base<0UL,_toml::local_date,_false>._M_head_impl;
      local_258.value.
      super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>.
      super__Tuple_impl<1UL,_toml::local_date_format_info,_toml::detail::region>.
      super__Tuple_impl<2UL,_toml::detail::region>.
      super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_._M_dataplus._M_p
           = (pointer)paVar2;
      region::~region((region *)&local_258);
      region::~region((region *)local_7c8);
    }
    local_568.field_2._M_allocated_capacity = local_6a8.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a8._M_dataplus._M_p == &local_6a8.field_2) goto LAB_003d94c4;
  }
  operator_delete(local_6a8._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
LAB_003d94c4:
  region::~region(&local_548);
  location::~location(&local_4e0);
  return __return_storage_ptr__;
}

Assistant:

result<std::tuple<local_date, local_date_format_info, region>, error_info>
parse_local_date_only(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    local_date_format_info fmt;

    // ----------------------------------------------------------------------
    // check syntax
    auto reg = syntax::local_date(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_local_date: "
            "invalid date: date must be like: 1234-05-06, yyyy-mm-dd.",
            syntax::local_date(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value
    const auto str = reg.as_string();

    // 0123456789
    // yyyy-mm-dd
    const auto year_r  = from_string<int>(str.substr(0, 4));
    const auto month_r = from_string<int>(str.substr(5, 2));
    const auto day_r   = from_string<int>(str.substr(8, 2));

    if(year_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_date: "
            "failed to read year `" + str.substr(0, 4) + "`",
            std::move(src), "here"));
    }
    if(month_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_date: "
            "failed to read month `" + str.substr(5, 2) + "`",
            std::move(src), "here"));
    }
    if(day_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_date: "
            "failed to read day `" + str.substr(8, 2) + "`",
            std::move(src), "here"));
    }

    const auto year  = year_r.unwrap();
    const auto month = month_r.unwrap();
    const auto day   = day_r.unwrap();

    {
        // We briefly check whether the input date is valid or not.
        //     Actually, because of the historical reasons, there are several
        // edge cases, such as 1582/10/5-1582/10/14 (only in several countries).
        // But here, we do not care about it.
        // It makes the code complicated and there is only low probability
        // that such a specific date is needed in practice. If someone need to
        // validate date accurately, that means that the one need a specialized
        // library for their purpose in another layer.

        const bool is_leap = (year % 4 == 0) && ((year % 100 != 0) || (year % 400 == 0));
        const auto max_day = [month, is_leap]() {
            if(month == 2)
            {
                return is_leap ? 29 : 28;
            }
            if(month == 4 || month == 6 || month == 9 || month == 11)
            {
                return 30;
            }
            return 31;
        }();

        if((month < 1 || 12 < month) || (day < 1 || max_day < day))
        {
            auto src = source_location(region(first));
            return err(make_error_info("toml::parse_local_date: invalid date.",
                std::move(src), "month must be 01-12, day must be any of "
                "01-28,29,30,31 depending on the month/year."));
        }
    }

    return ok(std::make_tuple(
            local_date(year, static_cast<month_t>(month - 1), day),
            std::move(fmt), std::move(reg)
        ));
}